

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

short __thiscall QByteArray::toShort(QByteArray *this,bool *ok,int base)

{
  QLocaleData *this_00;
  long lVar1;
  short sVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  bool bVar3;
  QByteArrayView num;
  QSimpleParsedNumber<long_long> QVar4;
  
  num.m_data._4_4_ = in_register_00000014;
  num.m_data._0_4_ = base;
  this_00 = (QLocaleData *)(this->d).size;
  bVar3 = true;
  if (this_00 != (QLocaleData *)0x0) {
    num.m_size = (qsizetype)(this->d).ptr;
    QVar4 = QLocaleData::bytearrayToLongLong(this_00,num,in_ECX);
    lVar1 = QVar4.result;
    if (0 < QVar4.used) {
      bVar3 = (short)QVar4.result != lVar1;
      goto LAB_003035e8;
    }
  }
  lVar1 = 0;
LAB_003035e8:
  if (ok != (bool *)0x0) {
    *ok = (bool)(bVar3 ^ 1);
  }
  sVar2 = 0;
  if (!bVar3) {
    sVar2 = (short)lVar1;
  }
  return sVar2;
}

Assistant:

short QByteArray::toShort(bool *ok, int base) const
{
    return QtPrivate::toIntegral<short>(qToByteArrayViewIgnoringNull(*this), ok, base);
}